

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O0

shared_ptr<mprpc::MpRpcMessage> __thiscall
mprpc::MpRpcClient::call(MpRpcClient *this,char *method,char *params,size_t params_size,int timeout)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int in_R9D;
  shared_ptr<mprpc::MpRpcMessage> sVar2;
  anon_class_40_5_382a26a6 local_178;
  function<void_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_150;
  anon_class_24_3_c8025669 local_130;
  function<void_(std::shared_ptr<mprpc::MpRpcMessage>)> local_118;
  undefined1 local_f8 [8];
  undefined1 local_f0 [16];
  undefined1 local_e0 [48];
  undefined1 local_b0 [8];
  unique_lock<std::mutex> lock;
  condition_variable local_98 [8];
  condition_variable cond;
  undefined1 local_68 [8];
  mutex mtx;
  int callid;
  int timeout_local;
  size_t params_size_local;
  char *params_local;
  char *method_local;
  MpRpcClient *this_local;
  shared_ptr<mprpc::MpRpcMessage> *rsp_msg;
  
  local_178.callid = std::__atomic_base<int>::operator++((__atomic_base<int> *)(method + 0x548));
  if (in_R9D == 0) {
    asnyc_call_abi_cxx11_
              ((MpRpcClient *)&mtx.super___mutex_base._M_mutex.__data.__list.__next,method,params,
               params_size,timeout);
    loop::
    Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~Future((Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mtx.super___mutex_base._M_mutex.__data.__list.__next);
    std::shared_ptr<mprpc::MpRpcMessage>::shared_ptr
              ((shared_ptr<mprpc::MpRpcMessage> *)this,(nullptr_t)0x0);
    _Var1._M_pi = extraout_RDX;
  }
  else {
    std::mutex::mutex((mutex *)local_68);
    std::condition_variable::condition_variable(local_98);
    lock._15_1_ = 0;
    std::shared_ptr<mprpc::MpRpcMessage>::shared_ptr((shared_ptr<mprpc::MpRpcMessage> *)this);
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_b0,(mutex *)local_68)
    ;
    asnyc_call_abi_cxx11_((MpRpcClient *)local_f8,method,params,params_size,timeout);
    loop::
    Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::in_loop((Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f0,(MessageLoop *)local_f8);
    local_130.mtx = (mutex *)local_68;
    local_130.cond = local_98;
    local_130.rsp_msg = (shared_ptr<mprpc::MpRpcMessage> *)this;
    std::function<void(std::shared_ptr<mprpc::MpRpcMessage>)>::
    function<mprpc::MpRpcClient::call(char_const*,char_const*,unsigned_long,int)::__0,void>
              ((function<void(std::shared_ptr<mprpc::MpRpcMessage>)> *)&local_118,&local_130);
    loop::
    FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::on_success((FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e0,(function<void_(std::shared_ptr<mprpc::MpRpcMessage>)> *)local_f0);
    local_178.mtx = (mutex *)local_68;
    local_178.cond = local_98;
    local_178.method = params;
    local_178.rsp_msg = (shared_ptr<mprpc::MpRpcMessage> *)this;
    std::function<void(std::shared_ptr<std::pair<int,std::__cxx11::string>>)>::
    function<mprpc::MpRpcClient::call(char_const*,char_const*,unsigned_long,int)::__1,void>
              ((function<void(std::shared_ptr<std::pair<int,std::__cxx11::string>>)> *)&local_150,
               &local_178);
    loop::
    FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::on_failure((FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_e0 + 0x10),
                 (function<void_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                  *)local_e0);
    loop::
    FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~FutureLoop((FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_e0 + 0x10));
    std::
    function<void_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
    ::~function(&local_150);
    loop::
    FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~FutureLoop((FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_e0);
    std::function<void_(std::shared_ptr<mprpc::MpRpcMessage>)>::~function(&local_118);
    loop::
    FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~FutureLoop((FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_f0);
    loop::
    Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~Future((Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8);
    std::condition_variable::wait((unique_lock *)local_98);
    lock._15_1_ = 1;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b0);
    if ((lock._15_1_ & 1) == 0) {
      std::shared_ptr<mprpc::MpRpcMessage>::~shared_ptr((shared_ptr<mprpc::MpRpcMessage> *)this);
    }
    std::condition_variable::~condition_variable(local_98);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mprpc::MpRpcMessage>)
         sVar2.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<MpRpcMessage> MpRpcClient::call(const char* method, const char* params, size_t params_size, int timeout)
    {
        int callid = ++m_cur_callid;

        if (!timeout) {
            asnyc_call(method, params, params_size, timeout);
            return nullptr;
        } else {
            mutex mtx;
            condition_variable  cond;
            shared_ptr<MpRpcMessage> rsp_msg;

            unique_lock<mutex> lock(mtx);

            asnyc_call(method, params, params_size, timeout)
                .in_loop(nullptr)
                .on_success([&mtx, &cond, &rsp_msg](shared_ptr<MpRpcMessage> msg) {
                    unique_lock<mutex> lock(mtx);
                    rsp_msg = msg;
                    cond.notify_one();
                })
                .on_failure([callid, method, &mtx, &cond, &rsp_msg](shared_ptr<pair<int, string>> e) {
                    auto rsp = make_shared<MpRpcMessage>();
                    rsp->err_code = e->first;
                    rsp->err_msg = e->second;
                    rsp->id = callid;
                    rsp->method = method;
                    unique_lock<mutex> lock(mtx);
                    rsp_msg = rsp;
                    cond.notify_one();
                });
        

            cond.wait(lock);
            return rsp_msg;
        }
    }